

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuHeapD.c
# Opt level: O3

void Fxu_HeapDoubleDelete(Fxu_HeapDouble *p,Fxu_Double *pDiv)

{
  int iVar1;
  int iVar2;
  Fxu_Double **ppFVar3;
  long lVar4;
  
  iVar1 = pDiv->HNum;
  lVar4 = (long)iVar1;
  if ((0 < lVar4) && (iVar1 <= p->nItemsAlloc)) {
    iVar2 = p->nItems;
    p->nItems = iVar2 + -1;
    p->pTree[lVar4] = p->pTree[iVar2];
    ppFVar3 = p->pTree;
    ppFVar3[lVar4]->HNum = iVar1;
    Fxu_HeapDoubleUpdate(p,ppFVar3[pDiv->HNum]);
    pDiv->HNum = 0;
    return;
  }
  __assert_fail("(pDiv)->HNum >= 1 && (pDiv)->HNum <= p->nItemsAlloc",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fxu/fxuHeapD.c"
                ,0xfc,"void Fxu_HeapDoubleDelete(Fxu_HeapDouble *, Fxu_Double *)");
}

Assistant:

void Fxu_HeapDoubleDelete( Fxu_HeapDouble * p, Fxu_Double * pDiv )
{
    FXU_HEAP_DOUBLE_ASSERT(p,pDiv);
    // put the last entry to the deleted place
    // decrement the number of entries
    p->pTree[pDiv->HNum] = p->pTree[p->nItems--];
    p->pTree[pDiv->HNum]->HNum = pDiv->HNum;
    // move the top entry down if necessary
    Fxu_HeapDoubleUpdate( p, p->pTree[pDiv->HNum] );
    pDiv->HNum = 0;
}